

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O3

void __thiscall wasm::Memory64Lowering::visitTableGrow(Memory64Lowering *this,TableGrow *curr)

{
  Table *pTVar1;
  TableGrow *local_30;
  Expression *size;
  
  pTVar1 = Module::getTable((this->
                            super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                            .
                            super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                            .currModule,(Name)(curr->table).super_IString.str);
  if ((pTVar1->addressType).id == 3) {
    wrapAddress64(this,&curr->delta,(Name)(curr->table).super_IString.str,true);
    local_30 = curr;
    extendAddress64(this,(Expression **)&local_30,(Name)(curr->table).super_IString.str,true);
    Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>,
               (Expression *)local_30);
  }
  return;
}

Assistant:

void visitTableGrow(TableGrow* curr) {
    auto& module = *getModule();
    auto* table = module.getTable(curr->table);
    if (table->is64()) {
      wrapTableAddress64(curr->delta, curr->table);
      auto* size = static_cast<Expression*>(curr);
      extendTableAddress64(size, curr->table);
      replaceCurrent(size);
    }
  }